

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_impl.hpp
# Opt level: O1

string * __thiscall
toml::detail::character_either::name_abi_cxx11_
          (string *__return_storage_ptr__,character_either *this)

{
  byte *pbVar1;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  undefined8 extraout_RDX_00;
  byte *pbVar3;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"character_either{","");
  pbVar3 = (this->chars_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pbVar1 = (this->chars_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pbVar3 != pbVar1) {
    uVar2 = extraout_RDX;
    do {
      show_char_abi_cxx11_(&local_50,(detail *)(ulong)*pbVar3,(int)uVar2);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __return_storage_ptr__,local_50._M_dataplus._M_p,local_50._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,", ");
      pbVar3 = pbVar3 + 1;
      uVar2 = extraout_RDX_00;
    } while (pbVar3 != pbVar1);
  }
  if ((this->chars_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->chars_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__);
  }
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,"}");
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE std::string character_either::name() const
{
    std::string n("character_either{");
    for(const auto c : this->chars_)
    {
        n += show_char(c);
        n += ", ";
    }
    if( ! this->chars_.empty())
    {
        n.pop_back();
        n.pop_back();
    }
    n += "}";
    return n;
}